

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

void duckdb_yyjson::yyjson_mut_doc_free(yyjson_mut_doc *doc)

{
  _func_void_void_ptr_void_ptr *UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  yyjson_str_chunk *pyVar2;
  yyjson_val_chunk *pyVar3;
  yyjson_str_chunk *pyVar4;
  yyjson_val_chunk *pyVar5;
  
  if (doc == (yyjson_mut_doc *)0x0) {
    return;
  }
  UNRECOVERED_JUMPTABLE = (doc->alc).free;
  pvVar1 = (doc->alc).ctx;
  (doc->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
  (doc->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
  (doc->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
  (doc->alc).ctx = (void *)0x0;
  pyVar4 = (doc->str_pool).chunks;
  while (pyVar4 != (yyjson_str_chunk *)0x0) {
    pyVar2 = pyVar4->next;
    (*UNRECOVERED_JUMPTABLE)(pvVar1,pyVar4);
    pyVar4 = pyVar2;
  }
  pyVar5 = (doc->val_pool).chunks;
  while (pyVar5 != (yyjson_val_chunk *)0x0) {
    pyVar3 = pyVar5->next;
    (*UNRECOVERED_JUMPTABLE)(pvVar1,pyVar5);
    pyVar5 = pyVar3;
  }
  (*UNRECOVERED_JUMPTABLE)(pvVar1,doc);
  return;
}

Assistant:

void yyjson_mut_doc_free(yyjson_mut_doc *doc) {
    if (doc) {
        yyjson_alc alc = doc->alc;
        memset(&doc->alc, 0, sizeof(alc));
        unsafe_yyjson_str_pool_release(&doc->str_pool, &alc);
        unsafe_yyjson_val_pool_release(&doc->val_pool, &alc);
        alc.free(alc.ctx, doc);
    }
}